

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O2

Vector3 * __thiscall
iDynTree::KinDynComputations::getCenterOfMassBiasAcc
          (Vector3 *__return_storage_ptr__,KinDynComputations *this)

{
  KinDynComputationsPrivateAttributes *pKVar1;
  Position com_in_inertial;
  Wrench totalMomentumBiasInCOMInertial;
  Wrench totalMomentumBiasInInertialInertial;
  Vector3 comVel;
  Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> local_158;
  KinDynComputations local_140;
  Transform local_128 [8];
  undefined1 local_120 [48];
  Wrench local_f0;
  Vector3 local_b8 [3];
  undefined1 local_70 [96];
  
  computeRawMassMatrixAndTotalMomentum(this);
  computeBiasAccFwdKinematics(this);
  local_f0._40_8_ = 0;
  local_f0._48_8_ = 0;
  local_f0._24_8_ = 0;
  local_f0._32_8_ = 0;
  local_f0._8_8_ = 0;
  local_f0._16_8_ = 0;
  local_f0._0_8_ = &PTR__SpatialForceVector_00137d10;
  pKVar1 = this->pimpl;
  iDynTree::ComputeLinearAndAngularMomentumDerivativeBias
            (&pKVar1->m_robot_model,&pKVar1->m_linkPos,&pKVar1->m_linkVel,&pKVar1->m_linkBiasAcc,
             &local_f0);
  getCenterOfMassPosition(&local_140);
  iDynTree::Rotation::Identity();
  iDynTree::Position::operator-((Position *)&local_158);
  iDynTree::Transform::Transform((Transform *)local_70,(Rotation *)local_b8,(Position *)&local_158);
  iDynTree::Transform::operator*(local_128,(Wrench *)local_70);
  getCenterOfMassVelocity(local_b8,this);
  KinDynComputationsPrivateAttributes::getRobotLockedInertia(this->pimpl);
  local_70._24_8_ = iDynTree::SpatialInertia::getMass();
  local_70._0_8_ = local_120;
  local_158._0_8_ = __return_storage_ptr__;
  Eigen::internal::
  call_assignment<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
            (&local_158,
             (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)local_70);
  iDynTree::SpatialForceVector::~SpatialForceVector((SpatialForceVector *)local_128);
  iDynTree::SpatialForceVector::~SpatialForceVector(&local_f0.super_SpatialForceVector);
  return __return_storage_ptr__;
}

Assistant:

Vector3 KinDynComputations::getCenterOfMassBiasAcc()
{
    this->computeRawMassMatrixAndTotalMomentum();
    this->computeBiasAccFwdKinematics();

    // We compute the bias of the center of mass from the bias of the total momentum derivative
    Wrench totalMomentumBiasInInertialInertial;
    ComputeLinearAndAngularMomentumDerivativeBias(pimpl->m_robot_model,
                                                  pimpl->m_linkPos,
                                                  pimpl->m_linkVel,
                                                  pimpl->m_linkBiasAcc,
                                                  totalMomentumBiasInInertialInertial);

    // The total momentum is written in the (inertial,inertial) frame
    // To get the com velocity, acceleration, we need to write it in the (com,inertial) frame
    // For the velocity we need just to multiply it for the adjoint, for the acceleration
    // we need also to account for the derivative of the adjoint term
    Position com_in_inertial = this->getCenterOfMassPosition();
    Wrench totalMomentumBiasInCOMInertial = Transform(Rotation::Identity(),-com_in_inertial)*totalMomentumBiasInInertialInertial;

    // TODO : cache com velocity
    Vector3 comVel = KinDynComputations::getCenterOfMassVelocity();

    // We account for the derivative of the transform (we can avoid this computation because we are intersted only in the linear part
    // of the momentum derivative
    // toEigen(totalMomentumBiasInCOMInertial.getAngularVec3()) =
    //    toEigen(pimpl->m_totalMomentum.getLinearVec3()).cross(toEigen(comVel));

    double total_mass = pimpl->getRobotLockedInertia().getMass();

    // Mass is constant, so we can easily divide disregarding the derivative
    Vector3 comBiasAcc;

    toEigen(comBiasAcc) = toEigen(totalMomentumBiasInCOMInertial.getLinearVec3())/total_mass;

    return comBiasAcc;
}